

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution_test_util.cc
# Opt level: O0

double absl::lts_20240722::random_internal::BetaIncomplete(double x,double p,double q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double beta;
  double q_local;
  double p_local;
  double x_local;
  
  if ((((p < 0.0) || (q < 0.0)) || (x < 0.0)) || (1.0 < x)) {
    x_local = std::numeric_limits<double>::infinity();
  }
  else {
    x_local = x;
    if (((x != 0.0) || (NAN(x))) && ((x != 1.0 || (NAN(x))))) {
      dVar1 = lgamma(p);
      dVar2 = lgamma(q);
      dVar3 = lgamma(p + q);
      x_local = anon_unknown_8::BetaIncompleteImpl(x,p,q,(dVar1 + dVar2) - dVar3);
    }
  }
  return x_local;
}

Assistant:

double BetaIncomplete(const double x, const double p, const double q) {
  // Error cases.
  if (p < 0 || q < 0 || x < 0 || x > 1.0) {
    return std::numeric_limits<double>::infinity();
  }
  if (x == 0 || x == 1) {
    return x;
  }
  // ln(Beta(p, q))
  double beta = std::lgamma(p) + std::lgamma(q) - std::lgamma(p + q);
  return BetaIncompleteImpl(x, p, q, beta);
}